

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V2_annotation.cpp
# Opt level: O2

bool __thiscall
ON_OBSOLETE_V5_Leader::GetTightBoundingBox
          (ON_OBSOLETE_V5_Leader *this,ON_BoundingBox *tight_bbox,bool bGrowBox,ON_Xform *xform)

{
  int c;
  ON_2dPoint *pOVar1;
  bool bVar2;
  long lVar3;
  ON_3dPointArray P;
  ON_SimpleArray<ON_3dPoint> local_60;
  ON_3dPoint local_48;
  
  c = (this->super_ON_OBSOLETE_V5_Annotation).m_points.super_ON_SimpleArray<ON_2dPoint>.m_count;
  if ((long)c < 2) {
    if (bGrowBox) {
      bVar2 = ON_BoundingBox::IsValid(tight_bbox);
      if (bVar2) {
        return true;
      }
      ON_BoundingBox::Destroy(tight_bbox);
    }
    bVar2 = false;
  }
  else {
    ON_3dPointArray::ON_3dPointArray((ON_3dPointArray *)&local_60,c);
    for (lVar3 = 0; (long)c * 0x10 != lVar3; lVar3 = lVar3 + 0x10) {
      pOVar1 = (this->super_ON_OBSOLETE_V5_Annotation).m_points.super_ON_SimpleArray<ON_2dPoint>.m_a
      ;
      ON_Plane::PointAt(&local_48,&(this->super_ON_OBSOLETE_V5_Annotation).m_plane,
                        *(double *)((long)&pOVar1->x + lVar3),*(double *)((long)&pOVar1->y + lVar3))
      ;
      ON_SimpleArray<ON_3dPoint>::Append(&local_60,&local_48);
    }
    bVar2 = ON_3dPointArray::GetTightBoundingBox
                      ((ON_3dPointArray *)&local_60,tight_bbox,bGrowBox,xform);
    bVar2 = bVar2 || bGrowBox;
    ON_SimpleArray<ON_3dPoint>::~ON_SimpleArray(&local_60);
  }
  return bVar2;
}

Assistant:

bool ON_OBSOLETE_V5_Leader::GetTightBoundingBox( 
		ON_BoundingBox& tight_bbox, 
    bool bGrowBox,
		const ON_Xform* xform
    ) const
{
  const int point_count = m_points.Count();
  if ( point_count >= 2 )
  {
    ON_3dPointArray P(point_count);
    int i;
    for ( i = 0; i < point_count; i++ )
    {
      ON_2dPoint uv = m_points[i];
      P.Append( m_plane.PointAt(uv.x,uv.y));
    }
    if ( P.GetTightBoundingBox( tight_bbox, bGrowBox, xform ) )
      bGrowBox = true;
  }
  else if ( bGrowBox && !tight_bbox.IsValid() )
  {
    tight_bbox.Destroy();
    bGrowBox = false;
  }

  return (0!=bGrowBox);
}